

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_pole_to_all_zero_digital_filter_coefficients.cc
# Opt level: O2

bool __thiscall
sptk::AllPoleToAllZeroDigitalFilterCoefficients::Run
          (AllPoleToAllZeroDigitalFilterCoefficients *this,
          vector<double,_std::allocator<double>_> *input_filter_coefficients,
          vector<double,_std::allocator<double>_> *output_filter_coefficients)

{
  bool bVar1;
  pointer pdVar2;
  double *pdVar3;
  double *pdVar4;
  size_type __new_size;
  double dVar5;
  
  if (this->is_valid_ == true) {
    pdVar3 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    __new_size = (long)pdVar4 - (long)pdVar3 >> 3;
    if (__new_size == (long)this->num_order_ + 1U) {
      bVar1 = false;
      if (output_filter_coefficients != (vector<double,_std::allocator<double>_> *)0x0) {
        dVar5 = *pdVar3;
        if ((dVar5 != 0.0) || (bVar1 = false, NAN(dVar5))) {
          pdVar2 = (output_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((long)(output_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 !=
              (long)pdVar4 - (long)pdVar3) {
            std::vector<double,_std::allocator<double>_>::resize
                      (output_filter_coefficients,__new_size);
            pdVar3 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pdVar4 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            dVar5 = *pdVar3;
            pdVar2 = (output_filter_coefficients->
                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          *pdVar2 = 1.0 / dVar5;
          while( true ) {
            pdVar2 = pdVar2 + 1;
            pdVar3 = pdVar3 + 1;
            if (pdVar3 == pdVar4) break;
            *pdVar2 = *pdVar3 * (1.0 / dVar5);
          }
          bVar1 = true;
        }
      }
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool AllPoleToAllZeroDigitalFilterCoefficients::Run(
    const std::vector<double>& input_filter_coefficients,
    std::vector<double>* output_filter_coefficients) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      input_filter_coefficients.size() != static_cast<std::size_t>(length) ||
      0.0 == input_filter_coefficients[0] ||
      NULL == output_filter_coefficients) {
    return false;
  }

  // Prepare memories.
  if (output_filter_coefficients->size() != static_cast<std::size_t>(length)) {
    output_filter_coefficients->resize(length);
  }

  // Perform conversion.
  const double z(1.0 / input_filter_coefficients[0]);
  (*output_filter_coefficients)[0] = z;
  std::transform(
      input_filter_coefficients.begin() + 1, input_filter_coefficients.end(),
      output_filter_coefficients->begin() + 1, [z](double x) { return x * z; });

  return true;
}